

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3AnalysisLoad(sqlite3 *db,int iDb)

{
  Table *pTVar1;
  char *zSql_00;
  Index *pIdx_1;
  Index *pIdx;
  int rc;
  char *zSql;
  HashElem *i;
  analysisInfo sInfo;
  int iDb_local;
  sqlite3 *db_local;
  
  pIdx._4_4_ = 0;
  for (zSql = (char *)((db->aDb[iDb].pSchema)->idxHash).first; zSql != (char *)0x0;
      zSql = *(char **)zSql) {
    **(undefined2 **)(*(long *)(zSql + 0x10) + 0x10) = 0;
  }
  sInfo.db = (sqlite3 *)db->aDb[iDb].zDbSName;
  i = (HashElem *)db;
  sInfo.zDatabase._4_4_ = iDb;
  pTVar1 = sqlite3FindTable(db,"sqlite_stat1",(char *)sInfo.db);
  if (pTVar1 != (Table *)0x0) {
    zSql_00 = sqlite3MPrintf(db,"SELECT tbl,idx,stat FROM %Q.sqlite_stat1",sInfo.db);
    if (zSql_00 == (char *)0x0) {
      pIdx._4_4_ = 7;
    }
    else {
      pIdx._4_4_ = sqlite3_exec(db,zSql_00,analysisLoader,&i,(char **)0x0);
      sqlite3DbFree(db,zSql_00);
    }
  }
  for (zSql = (char *)((db->aDb[sInfo.zDatabase._4_4_].pSchema)->idxHash).first; zSql != (char *)0x0
      ; zSql = *(char **)zSql) {
    if (*(*(Index **)(zSql + 0x10))->aiRowLogEst == 0) {
      sqlite3DefaultRowEst(*(Index **)(zSql + 0x10));
    }
  }
  if (pIdx._4_4_ == 7) {
    sqlite3OomFault(db);
  }
  return pIdx._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3AnalysisLoad(sqlite3 *db, int iDb){
  analysisInfo sInfo;
  HashElem *i;
  char *zSql;
  int rc = SQLITE_OK;

  assert( iDb>=0 && iDb<db->nDb );
  assert( db->aDb[iDb].pBt!=0 );

  /* Clear any prior statistics */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&db->aDb[iDb].pSchema->idxHash);i;i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    pIdx->aiRowLogEst[0] = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3DeleteIndexSamples(db, pIdx);
    pIdx->aSample = 0;
#endif
  }

  /* Load new statistics out of the sqlite_stat1 table */
  sInfo.db = db;
  sInfo.zDatabase = db->aDb[iDb].zDbSName;
  if( sqlite3FindTable(db, "sqlite_stat1", sInfo.zDatabase)!=0 ){
    zSql = sqlite3MPrintf(db, 
        "SELECT tbl,idx,stat FROM %Q.sqlite_stat1", sInfo.zDatabase);
    if( zSql==0 ){
      rc = SQLITE_NOMEM_BKPT;
    }else{
      rc = sqlite3_exec(db, zSql, analysisLoader, &sInfo, 0);
      sqlite3DbFree(db, zSql);
    }
  }

  /* Set appropriate defaults on all indexes not in the sqlite_stat1 table */
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(i=sqliteHashFirst(&db->aDb[iDb].pSchema->idxHash);i;i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    if( pIdx->aiRowLogEst[0]==0 ) sqlite3DefaultRowEst(pIdx);
  }

  /* Load the statistics from the sqlite_stat4 table. */
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( rc==SQLITE_OK && OptimizationEnabled(db, SQLITE_Stat34) ){
    db->lookaside.bDisable++;
    rc = loadStat4(db, sInfo.zDatabase);
    db->lookaside.bDisable--;
  }
  for(i=sqliteHashFirst(&db->aDb[iDb].pSchema->idxHash);i;i=sqliteHashNext(i)){
    Index *pIdx = sqliteHashData(i);
    sqlite3_free(pIdx->aiRowEst);
    pIdx->aiRowEst = 0;
  }
#endif

  if( rc==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
  return rc;
}